

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_hex_test.cxx
# Opt level: O2

void __thiscall pangram_to_hex_test::test_method(pangram_to_hex_test *this)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  string output;
  string input;
  string expected;
  char *local_68;
  char *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  undefined **local_38;
  undefined1 local_30;
  undefined8 *local_28;
  char *local_20;
  
  std::__cxx11::string::string
            ((string *)&input,"The quick brown fox jumps over the lazy dog",(allocator *)&expected);
  std::__cxx11::string::string
            ((string *)&expected,
             "54686520717569636b2062726f776e20666f78206a756d7073206f76657220746865206c617a7920646f67"
             ,(allocator *)&output);
  cryptox::to_hex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&output,(cryptox *)input._M_dataplus._M_p,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(input._M_dataplus._M_p + input._M_string_length),in_RCX);
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/detail/to_hex_test.cxx"
  ;
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_48,0x1e);
  local_30 = 0;
  local_38 = &PTR__lazy_ostream_002b7238;
  local_28 = &boost::unit_test::lazy_ostream::inst;
  local_20 = "";
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/detail/to_hex_test.cxx"
  ;
  local_60 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_38,&local_68,0x1e,1,2,&output,"output",&expected,"expected");
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&expected);
  std::__cxx11::string::~string((string *)&input);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(pangram_to_hex_test) {
	const std::string input    = "The quick brown fox jumps over the lazy dog";
	const std::string expected = "54686520717569636b2062726f776e20666f78206a7"
				     "56d7073206f76657220746865206c617a7920646f67";

	std::string output = cryptox::to_hex(input.begin(), input.end());
	BOOST_CHECK_EQUAL(output, expected);
}